

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O3

fe_t * fe_init_auto_r(cmd_ln_t *config)

{
  uint uVar1;
  short sVar2;
  int iVar3;
  fe_t *fe;
  int16 *piVar4;
  window_t *in;
  melfb_t *mel;
  ulong uVar5;
  noise_stats_t *pnVar6;
  frame_t *pfVar7;
  powspec_t *ppVar8;
  short sVar9;
  char *pcVar10;
  long lVar11;
  double dVar12;
  
  fe = (fe_t *)__ckd_calloc__(1,0x88,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                              ,0xdd);
  fe->refcount = 1;
  iVar3 = fe_parse_general_params(config,fe);
  if (-1 < iVar3) {
    sVar9 = (short)(int)((float)fe->sampling_rate / (float)(int)fe->frame_rate + 0.5);
    fe->frame_shift = sVar9;
    sVar2 = (short)(int)((float)fe->sampling_rate * (float)fe->window_length + 0.5);
    fe->frame_size = sVar2;
    fe->pre_emphasis_prior = 0;
    if (sVar9 < 2) {
      __assert_fail("fe->frame_shift > 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                    ,0xee,"fe_t *fe_init_auto_r(cmd_ln_t *)");
    }
    if (sVar2 < sVar9) {
      pcVar10 = "Frame size %d (-wlen) must be greater than frame shift %d (-frate)\n";
      lVar11 = 0xf2;
    }
    else {
      sVar9 = fe->fft_size;
      if (sVar2 <= sVar9) {
        if (fe->dither != '\0') {
          uVar1 = fe->dither_seed;
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                  ,0x139,"You are using %d as the seed.\n",(ulong)uVar1);
          genrand_seed((long)(int)uVar1);
          sVar2 = fe->frame_size;
        }
        piVar4 = (int16 *)__ckd_calloc__((long)sVar2,4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                                         ,0x103);
        fe->overflow_samps = piVar4;
        in = (window_t *)
             __ckd_calloc__((long)(short)((uint)(int)(short)(fe->frame_size -
                                                            (fe->frame_size >> 0xf)) >> 1),8,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                            ,0x104);
        fe->hamming_window = in;
        fe_create_hamming(in,(int)fe->frame_size);
        mel = (melfb_t *)
              __ckd_calloc__(1,0x78,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                             ,0x10a);
        fe->mel_fb = mel;
        mel->sampling_rate = fe->sampling_rate;
        mel->fft_size = (int)fe->fft_size;
        mel->num_cepstra = (uint)fe->num_cepstra;
        uVar5 = ps_config_int(config,"nfilt");
        mel->num_filters = (int32)uVar5;
        if (fe->log_spec == '\0') {
          uVar5 = (ulong)fe->num_cepstra;
        }
        fe->feature_dimension = (uint8)uVar5;
        dVar12 = ps_config_float(config,"upperf");
        mel->upper_filt_freq = (float32)(float)dVar12;
        dVar12 = ps_config_float(config,"lowerf");
        mel->lower_filt_freq = (float32)(float)dVar12;
        iVar3 = ps_config_bool(config,"doublebw");
        mel->doublewide = iVar3;
        pcVar10 = ps_config_str(config,"warp_type");
        mel->warp_type = pcVar10;
        pcVar10 = ps_config_str(config,"warp_params");
        mel->warp_params = pcVar10;
        lVar11 = ps_config_int(config,"lifter");
        mel->lifter_val = (int32)lVar11;
        iVar3 = ps_config_bool(config,"unit_area");
        mel->unit_area = iVar3;
        iVar3 = ps_config_bool(config,"round_filters");
        mel->round_filters = iVar3;
        iVar3 = fe_warp_set(mel,mel->warp_type);
        if (iVar3 == 0) {
          fe_warp_set_parameters(mel,mel->warp_params,(float)mel->sampling_rate);
        }
        else {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                  ,0xae,"Failed to initialize the warping function.\n");
        }
        if ((float)fe->mel_fb->upper_filt_freq <= (float)fe->sampling_rate * 0.5 + 1.0) {
          fe_build_melfilters(fe->mel_fb);
          fe_compute_melcosine(fe->mel_fb);
          iVar3 = ps_config_bool(config,"remove_noise");
          if (iVar3 != 0) {
            pnVar6 = fe_init_noisestats(fe->mel_fb->num_filters);
            fe->noise_stats = pnVar6;
          }
          piVar4 = (int16 *)__ckd_calloc__((long)fe->frame_size,2,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                                           ,0x11d);
          fe->spch = piVar4;
          pfVar7 = (frame_t *)
                   __ckd_calloc__((long)fe->fft_size,8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                                  ,0x11e);
          fe->frame = pfVar7;
          ppVar8 = (powspec_t *)
                   __ckd_calloc__((long)fe->fft_size,8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                                  ,0x11f);
          fe->spec = ppVar8;
          ppVar8 = (powspec_t *)
                   __ckd_calloc__((long)fe->mel_fb->num_filters,8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                                  ,0x120);
          fe->mfspec = ppVar8;
          sVar9 = fe->fft_size;
          sVar2 = sVar9 + 3;
          if (-1 < sVar9) {
            sVar2 = sVar9;
          }
          pfVar7 = (frame_t *)
                   __ckd_calloc__((long)(short)((uint)(int)sVar2 >> 2),8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                                  ,0x123);
          fe->ccc = pfVar7;
          sVar9 = fe->fft_size;
          sVar2 = sVar9 + 3;
          if (-1 < sVar9) {
            sVar2 = sVar9;
          }
          pfVar7 = (frame_t *)
                   __ckd_calloc__((long)(short)((uint)(int)sVar2 >> 2),8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                                  ,0x124);
          fe->sss = pfVar7;
          fe_create_twiddle(fe);
          iVar3 = ps_config_bool(config,"verbose");
          if (iVar3 != 0) {
            fe_print_current(fe);
          }
          fe->num_overflow_samps = 0;
          memset(fe->overflow_samps,0,(long)fe->frame_size * 2);
          fe->pre_emphasis_prior = 0;
          return fe;
        }
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                ,0x111,"Upper frequency %.1f is higher than samprate/2 (%.1f)\n");
        goto LAB_00124633;
      }
      pcVar10 = "Number of FFT points has to be a power of 2 higher than %d, it is %d\n";
      lVar11 = 0xfa;
    }
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
            ,lVar11,pcVar10,(ulong)(uint)(int)sVar2,(ulong)(uint)(int)sVar9);
  }
LAB_00124633:
  fe_free(fe);
  return (fe_t *)0x0;
}

Assistant:

fe_t *
fe_init_auto_r(cmd_ln_t *config)
{
    fe_t *fe;

    fe = (fe_t*)ckd_calloc(1, sizeof(*fe));
    fe->refcount = 1;

    /* transfer params to front end */
    if (fe_parse_general_params(config, fe) < 0) {
        fe_free(fe);
        return NULL;
    }

    /* compute remaining fe parameters */
    /* We add 0.5 so approximate the float with the closest
     * integer. E.g., 2.3 is truncate to 2, whereas 3.7 becomes 4
     */
    fe->frame_shift = (int32) (fe->sampling_rate / fe->frame_rate + 0.5);
    fe->frame_size = (int32) (fe->window_length * fe->sampling_rate + 0.5);
    fe->pre_emphasis_prior = 0;

    assert (fe->frame_shift > 1);
    if (fe->frame_size < fe->frame_shift) {
        E_ERROR
            ("Frame size %d (-wlen) must be greater than frame shift %d (-frate)\n",
             fe->frame_size, fe->frame_shift);
        fe_free(fe);
        return NULL;
    }

    if (fe->frame_size > (fe->fft_size)) {
        E_ERROR
            ("Number of FFT points has to be a power of 2 higher than %d, it is %d\n",
             fe->frame_size, fe->fft_size);
        fe_free(fe);
        return NULL;
    }

    if (fe->dither)
        fe_init_dither(fe->dither_seed);

    /* establish buffers for overflow samps and hamming window */
    fe->overflow_samps = ckd_calloc(fe->frame_size, sizeof(float32));
    fe->hamming_window = ckd_calloc(fe->frame_size/2, sizeof(window_t));

    /* create hamming window */
    fe_create_hamming(fe->hamming_window, fe->frame_size);

    /* init and fill appropriate filter structure */
    fe->mel_fb = ckd_calloc(1, sizeof(*fe->mel_fb));

    /* transfer params to mel fb */
    fe_parse_melfb_params(config, fe, fe->mel_fb);
    
    if (fe->mel_fb->upper_filt_freq > fe->sampling_rate / 2 + 1.0) {
	E_ERROR("Upper frequency %.1f is higher than samprate/2 (%.1f)\n", 
		fe->mel_fb->upper_filt_freq, fe->sampling_rate / 2);
	fe_free(fe);
	return NULL;
    }
    
    fe_build_melfilters(fe->mel_fb);
    fe_compute_melcosine(fe->mel_fb);
    if (ps_config_bool(config, "remove_noise"))
        fe->noise_stats = fe_init_noisestats(fe->mel_fb->num_filters);

    /* Create temporary FFT, spectrum and mel-spectrum buffers. */
    /* FIXME: Gosh there are a lot of these. */
    fe->spch = ckd_calloc(fe->frame_size, sizeof(*fe->spch));
    fe->frame = ckd_calloc(fe->fft_size, sizeof(*fe->frame));
    fe->spec = ckd_calloc(fe->fft_size, sizeof(*fe->spec));
    fe->mfspec = ckd_calloc(fe->mel_fb->num_filters, sizeof(*fe->mfspec));

    /* create twiddle factors */
    fe->ccc = ckd_calloc(fe->fft_size / 4, sizeof(*fe->ccc));
    fe->sss = ckd_calloc(fe->fft_size / 4, sizeof(*fe->sss));
    fe_create_twiddle(fe);

    if (ps_config_bool(config, "verbose")) {
        fe_print_current(fe);
    }

    /*** Initialize the overflow buffers ***/
    fe_start_utt(fe);
    return fe;
}